

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

LY_ERR lys_compile_node_action(lysc_ctx *ctx,lysp_node *pnode,lysc_node *node)

{
  undefined1 local_108 [8];
  lysp_node_action_inout implicit_output;
  lysp_node_action_inout *output;
  lysp_node_action_inout implicit_input;
  lysp_node_action_inout *input;
  lysc_node_action *action;
  lysp_node_action *action_p;
  LY_ERR ret;
  lysc_node *node_local;
  lysp_node *pnode_local;
  lysc_ctx *ctx_local;
  
  memset(&output,0,0x60);
  implicit_input.field_0._0_2_ = 0x1000;
  implicit_input.field_0.node.next = (lysp_node *)0x243015;
  output = (lysp_node_action_inout *)pnode;
  memset(local_108,0,0x60);
  implicit_output.field_0._0_2_ = 0x2000;
  implicit_output.field_0.node.next = (lysp_node *)anon_var_dwarf_30259;
  local_108 = (undefined1  [8])pnode;
  lysc_update_path(ctx,node->module,"input");
  if (*(short *)&pnode[1].name == 0) {
    implicit_input.child = (lysp_node *)&output;
  }
  else {
    implicit_input.child = (lysp_node *)&pnode[1].next;
  }
  action_p._4_4_ =
       lys_compile_node_(ctx,implicit_input.child,node,0,lys_compile_node_action_inout,
                         (lysc_node *)&node[1].module,(ly_set *)0x0);
  lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
  if ((action_p._4_4_ == LY_SUCCESS) &&
     (action_p._4_4_ = lysc_unres_must_add(ctx,(lysc_node *)&node[1].module,implicit_input.child),
     action_p._4_4_ == LY_SUCCESS)) {
    lysc_update_path(ctx,node->module,"output");
    if (*(short *)&pnode[2].exts == 0) {
      implicit_output.child = (lysp_node *)local_108;
    }
    else {
      implicit_output.child = (lysp_node *)&pnode[2].iffeatures;
    }
    action_p._4_4_ =
         lys_compile_node_(ctx,implicit_output.child,node,0,lys_compile_node_action_inout,
                           (lysc_node *)&node[2].next,(ly_set *)0x0);
    lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
    if (action_p._4_4_ == LY_SUCCESS) {
      action_p._4_4_ = lysc_unres_must_add(ctx,(lysc_node *)&node[2].next,implicit_output.child);
    }
  }
  return action_p._4_4_;
}

Assistant:

static LY_ERR
lys_compile_node_action(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysc_node *node)
{
    LY_ERR ret;
    struct lysp_node_action *action_p = (struct lysp_node_action *)pnode;
    struct lysc_node_action *action = (struct lysc_node_action *)node;
    struct lysp_node_action_inout *input, implicit_input = {
        .nodetype = LYS_INPUT,
        .name = "input",
        .parent = pnode,
    };
    struct lysp_node_action_inout *output, implicit_output = {
        .nodetype = LYS_OUTPUT,
        .name = "output",
        .parent = pnode,
    };

    /* input */
    lysc_update_path(ctx, action->module, "input");
    if (action_p->input.nodetype == LYS_UNKNOWN) {
        input = &implicit_input;
    } else {
        input = &action_p->input;
    }
    ret = lys_compile_node_(ctx, &input->node, &action->node, 0, lys_compile_node_action_inout, &action->input.node, NULL);
    lysc_update_path(ctx, NULL, NULL);
    LY_CHECK_GOTO(ret, done);

    /* add must(s) to unres */
    ret = lysc_unres_must_add(ctx, &action->input.node, &input->node);
    LY_CHECK_GOTO(ret, done);

    /* output */
    lysc_update_path(ctx, action->module, "output");
    if (action_p->output.nodetype == LYS_UNKNOWN) {
        output = &implicit_output;
    } else {
        output = &action_p->output;
    }
    ret = lys_compile_node_(ctx, &output->node, &action->node, 0, lys_compile_node_action_inout, &action->output.node, NULL);
    lysc_update_path(ctx, NULL, NULL);
    LY_CHECK_GOTO(ret, done);

    /* add must(s) to unres */
    ret = lysc_unres_must_add(ctx, &action->output.node, &output->node);
    LY_CHECK_GOTO(ret, done);

done:
    return ret;
}